

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureLevelCommonCase::generateTestIterations
          (TextureLevelCommonCase *this,
          vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
          *iterations)

{
  uint uVar1;
  code *pcVar2;
  code *pcVar3;
  int iVar4;
  deUint32 err;
  undefined4 extraout_var;
  TextureFormat *pTVar5;
  TestError *this_00;
  TextureFormat TVar6;
  pointer piVar7;
  uint uVar8;
  TextureGenerationSpec texGen;
  TextureLevelSpec level;
  int sampleCount;
  vector<int,_std::allocator<int>_> samples;
  string local_120;
  undefined1 local_100 [32];
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
  local_e0;
  _Alloc_hider local_c8;
  size_type local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined8 local_a8;
  uint uStack_a0;
  int iStack_9c;
  GLenum GStack_98;
  bool local_94;
  TextureFormat local_88;
  TextureFormat local_80;
  long local_78;
  TextureFormat TStack_70;
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
  *local_68;
  int local_5c;
  code *local_58;
  uint local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_68 = iterations;
  iVar4 = (*((this->super_TextureLevelCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  pcVar2 = *(code **)(CONCAT44(extraout_var,iVar4) + 0x800);
  pcVar3 = *(code **)(CONCAT44(extraout_var,iVar4) + 0x880);
  local_88.order = ~R;
  uVar1 = (this->super_TextureLevelCase).m_target;
  if ((uVar1 & 0xfffffffd) == 0x9100) {
    (*pcVar3)(uVar1,0x8058,0x9380,1,&local_88);
    if ((long)(int)local_88.order < 0) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      local_100._0_8_ = local_100 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_100,"internal format query failed","");
      tcu::TestError::TestError(this_00,(string *)local_100);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    std::vector<int,_std::allocator<int>_>::resize(&local_48,(long)(int)local_88.order);
    piVar7 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    if (0 < (int)local_88.order) {
      (*pcVar3)((this->super_TextureLevelCase).m_target,0x8058,0x80a9);
      err = (*pcVar2)();
      glu::checkError(err,"get max samples",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureLevelStateQueryTests.cpp"
                      ,0x38e);
      piVar7 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
  }
  else {
    piVar7 = (pointer)0x0;
  }
  if (piVar7 == local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    local_5c = -1;
  }
  else {
    local_5c = *piVar7;
  }
  uVar1 = (this->super_TextureLevelCase).m_target;
  uVar8 = 0x8518;
  if (uVar1 != 0x8513) {
    uVar8 = uVar1;
  }
  local_100._20_4_ = 0x100;
  local_100[0x18] = false;
  local_e0.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e0.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e0.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0 = 0;
  local_b8._M_local_buf[0] = '\0';
  local_100._4_4_ = uVar8;
  local_100._0_4_ = uVar1;
  local_100[8] = true;
  local_100[9] = true;
  local_100._12_4_ = 0;
  local_100._16_4_ = 0;
  local_a8 = glu::getTextureTargetName;
  local_c8._M_p = (pointer)&local_b8;
  uStack_a0 = uVar1;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_120,&local_a8);
  pTVar5 = (TextureFormat *)std::__cxx11::string::append((char *)&local_120);
  TVar6 = (TextureFormat)(pTVar5 + 2);
  if (*pTVar5 == TVar6) {
    local_78 = *(long *)TVar6;
    TStack_70 = pTVar5[3];
    local_88 = (TextureFormat)&local_78;
  }
  else {
    local_78 = *(long *)TVar6;
    local_88 = *pTVar5;
  }
  local_80 = pTVar5[1];
  *pTVar5 = TVar6;
  pTVar5[1].order = R;
  pTVar5[1].type = SNORM_INT8;
  *(undefined1 *)&pTVar5[2].order = R;
  std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_88);
  if (local_88 != (TextureFormat)&local_78) {
    operator_delete((void *)local_88,local_78 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
  ::push_back(local_68,(value_type *)local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_p != &local_b8) {
    operator_delete(local_c8._M_p,
                    CONCAT71(local_b8._M_allocated_capacity._1_7_,local_b8._M_local_buf[0]) + 1);
  }
  if (local_e0.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e0.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_50 = uVar1;
  if ((uVar1 & 0xfffffffd) != 0x9100) {
    if (uVar1 == 0x8c2a) {
      local_100[8] = true;
      local_100[9] = true;
      local_100._12_4_ = 0;
      local_100._16_4_ = 0;
      local_100._20_4_ = 0x100;
      local_100[0x18] = false;
      local_e0.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e0.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_e0.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_c0 = 0;
      local_b8._M_local_buf[0] = '\0';
      local_a8._0_4_ = 0;
      local_a8._4_4_ = 0;
      uStack_a0 = 0;
      iStack_9c = 0;
      GStack_98 = 0x1908;
      local_94 = false;
      local_c8._M_p = (pointer)&local_b8;
      local_88 = glu::mapGLInternalFormat(0x8058);
      iVar4 = tcu::TextureFormat::getPixelSize(&local_88);
      local_100._0_8_ = (pointer)0x8c2a00008c2a;
      local_100[8] = true;
      local_58 = glu::getTextureTargetName;
      local_50 = 0x8c2a;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_120,&local_58);
      pTVar5 = (TextureFormat *)std::__cxx11::string::append((char *)&local_120);
      TVar6 = (TextureFormat)(pTVar5 + 2);
      if (*pTVar5 == TVar6) {
        local_78 = *(long *)TVar6;
        TStack_70 = pTVar5[3];
        local_88 = (TextureFormat)&local_78;
      }
      else {
        local_78 = *(long *)TVar6;
        local_88 = *pTVar5;
      }
      local_80 = pTVar5[1];
      *pTVar5 = TVar6;
      pTVar5[1].order = R;
      pTVar5[1].type = SNORM_INT8;
      *(undefined1 *)&pTVar5[2].order = R;
      std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_88);
      if (local_88 != (TextureFormat)&local_78) {
        operator_delete((void *)local_88,local_78 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      local_100._16_4_ = 0;
      local_100._20_4_ = iVar4 * 0x21 + -1;
      local_100[0x18] = true;
      local_a8._0_4_ = 0x20;
      local_a8._4_4_ = 1;
      uStack_a0 = 1;
      iStack_9c = 0;
      GStack_98 = 0x8058;
      local_94 = false;
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
      ::push_back(&local_e0,(value_type *)&local_a8);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
      ::push_back(local_68,(value_type *)local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_p != &local_b8) {
        operator_delete(local_c8._M_p,
                        CONCAT71(local_b8._M_allocated_capacity._1_7_,local_b8._M_local_buf[0]) + 1)
        ;
      }
      if (local_e0.
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e0.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_e0.
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_e0.
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      local_100[8] = true;
      local_100[9] = true;
      local_100._12_4_ = 0;
      local_100._16_4_ = 0;
      local_100._20_4_ = 0x100;
      local_100[0x18] = false;
      local_e0.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e0.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_e0.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_c0 = 0;
      local_b8._M_local_buf[0] = '\0';
      local_a8._0_4_ = 0;
      local_a8._4_4_ = 0;
      uStack_a0 = 0;
      iStack_9c = 0;
      GStack_98 = 0x1908;
      local_94 = false;
      local_c8._M_p = (pointer)&local_b8;
      local_88 = glu::mapGLInternalFormat(0x8058);
      iVar4 = tcu::TextureFormat::getPixelSize(&local_88);
      local_100._0_8_ = (pointer)0x8c2a00008c2a;
      local_100[8] = true;
      local_58 = glu::getTextureTargetName;
      local_50 = 0x8c2a;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_120,&local_58);
      pTVar5 = (TextureFormat *)std::__cxx11::string::append((char *)&local_120);
      TVar6 = (TextureFormat)(pTVar5 + 2);
      if (*pTVar5 == TVar6) {
        local_78 = *(long *)TVar6;
        TStack_70 = pTVar5[3];
        local_88 = (TextureFormat)&local_78;
      }
      else {
        local_78 = *(long *)TVar6;
        local_88 = *pTVar5;
      }
      local_80 = pTVar5[1];
      *pTVar5 = TVar6;
      pTVar5[1].order = R;
      pTVar5[1].type = SNORM_INT8;
      *(undefined1 *)&pTVar5[2].order = R;
      std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_88);
      if (local_88 != (TextureFormat)&local_78) {
        operator_delete((void *)local_88,local_78 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
      local_100._16_4_ = 0x100;
      local_100._20_4_ = iVar4 * 0x11 + -1;
      local_100[0x18] = false;
      local_a8._0_4_ = 0x10;
      local_a8._4_4_ = 1;
      uStack_a0 = 1;
      iStack_9c = 0;
      GStack_98 = 0x8058;
      local_94 = false;
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
      ::push_back(&local_e0,(value_type *)&local_a8);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
      ::push_back(local_68,(value_type *)local_100);
      goto LAB_014e4e90;
    }
    local_100._12_4_ = 0;
    local_100._16_4_ = 0;
    local_100._20_4_ = 0x100;
    local_100[0x18] = false;
    local_e0.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e0.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e0.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c0 = 0;
    local_b8._M_local_buf[0] = '\0';
    local_100[8] = true;
    local_100[9] = true;
    local_a8._0_4_ = 0;
    local_a8._4_4_ = 0;
    uStack_a0 = 0;
    iStack_9c = 0;
    GStack_98 = 0x1908;
    local_94 = false;
    local_58 = glu::getTextureTargetName;
    local_c8._M_p = (pointer)&local_b8;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_120,&local_58);
    pTVar5 = (TextureFormat *)std::__cxx11::string::append((char *)&local_120);
    TVar6 = (TextureFormat)(pTVar5 + 2);
    if (*pTVar5 == TVar6) {
      local_78 = *(long *)TVar6;
      TStack_70 = pTVar5[3];
      local_88 = (TextureFormat)&local_78;
    }
    else {
      local_78 = *(long *)TVar6;
      local_88 = *pTVar5;
    }
    local_80 = pTVar5[1];
    *pTVar5 = TVar6;
    pTVar5[1].order = R;
    pTVar5[1].type = SNORM_INT8;
    *(undefined1 *)&pTVar5[2].order = R;
    std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_88);
    if (local_88 != (TextureFormat)&local_78) {
      operator_delete((void *)local_88,local_78 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    local_a8._0_4_ = 0x20;
    local_a8._4_4_ = 0x20;
    uStack_a0 = 1;
    if ((int)local_100._0_4_ < 0x9009) {
      if ((local_100._0_4_ == 0x806f) || (local_100._0_4_ == 0x8c1a)) {
LAB_014e4807:
        uStack_a0 = 6;
      }
    }
    else if ((local_100._0_4_ == 0x9009) || (local_100._0_4_ == 0x9102)) goto LAB_014e4807;
    iStack_9c = 0;
    GStack_98 = 0x8058;
    local_94 = false;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ::push_back(&local_e0,(value_type *)&local_a8);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
    ::push_back(local_68,(value_type *)local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_p != &local_b8) {
      operator_delete(local_c8._M_p,
                      CONCAT71(local_b8._M_allocated_capacity._1_7_,local_b8._M_local_buf[0]) + 1);
    }
    if (local_e0.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e0.
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_e0.
                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_e0.
                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    local_100._12_4_ = 0;
    local_100._16_4_ = 0;
    local_100._20_4_ = 0x100;
    local_100[0x18] = false;
    local_e0.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e0.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e0.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c0 = 0;
    local_b8._M_local_buf[0] = '\0';
    local_100[8] = false;
    local_100[9] = true;
    local_a8._0_4_ = 0;
    local_a8._4_4_ = 0;
    uStack_a0 = 0;
    iStack_9c = 0;
    GStack_98 = 0x1908;
    local_94 = false;
    local_100._0_4_ = uVar1;
    local_58 = glu::getTextureTargetName;
    local_c8._M_p = (pointer)&local_b8;
    local_50 = uVar1;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_120,&local_58);
    pTVar5 = (TextureFormat *)std::__cxx11::string::append((char *)&local_120);
    TVar6 = (TextureFormat)(pTVar5 + 2);
    if (*pTVar5 == TVar6) {
      local_78 = *(long *)TVar6;
      TStack_70 = pTVar5[3];
      local_88 = (TextureFormat)&local_78;
    }
    else {
      local_78 = *(long *)TVar6;
      local_88 = *pTVar5;
    }
    local_80 = pTVar5[1];
    *pTVar5 = TVar6;
    pTVar5[1].order = R;
    pTVar5[1].type = SNORM_INT8;
    *(undefined1 *)&pTVar5[2].order = R;
    std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_88);
    if (local_88 != (TextureFormat)&local_78) {
      operator_delete((void *)local_88,local_78 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    local_a8._4_4_ = 0x40;
    if (uVar1 == 0x9009 || uVar1 == 0x8513) {
      local_a8._4_4_ = 0x10;
    }
    local_a8._0_4_ = 0x10;
    uStack_a0 = 1;
    if ((int)local_100._0_4_ < 0x9009) {
      if ((local_100._0_4_ == 0x806f) || (local_100._0_4_ == 0x8c1a)) {
LAB_014e4bbe:
        uStack_a0 = 6;
      }
    }
    else if ((local_100._0_4_ == 0x9009) || (local_100._0_4_ == 0x9102)) goto LAB_014e4bbe;
    iStack_9c = 0;
    GStack_98 = 0x8058;
    local_94 = false;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ::push_back(&local_e0,(value_type *)&local_a8);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
    ::push_back(local_68,(value_type *)local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_p != &local_b8) {
      operator_delete(local_c8._M_p,
                      CONCAT71(local_b8._M_allocated_capacity._1_7_,local_b8._M_local_buf[0]) + 1);
    }
    if (local_e0.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e0.
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_e0.
                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_e0.
                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    local_100._12_4_ = 0;
    local_100._16_4_ = 0;
    local_100._20_4_ = 0x100;
    local_100[0x18] = false;
    local_e0.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e0.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e0.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c0 = 0;
    local_b8._M_local_buf[0] = '\0';
    local_100[8] = false;
    local_100[9] = true;
    local_a8._0_4_ = 0;
    local_a8._4_4_ = 0;
    uStack_a0 = 0;
    iStack_9c = 0;
    GStack_98 = 0x1908;
    local_94 = false;
    local_100._0_4_ = uVar1;
    local_58 = glu::getTextureTargetName;
    local_c8._M_p = (pointer)&local_b8;
    local_50 = uVar1;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_120,&local_58);
    pTVar5 = (TextureFormat *)std::__cxx11::string::append((char *)&local_120);
    TVar6 = (TextureFormat)(pTVar5 + 2);
    if (*pTVar5 == TVar6) {
      local_78 = *(long *)TVar6;
      TStack_70 = pTVar5[3];
      local_88 = (TextureFormat)&local_78;
    }
    else {
      local_78 = *(long *)TVar6;
      local_88 = *pTVar5;
    }
    local_80 = pTVar5[1];
    *pTVar5 = TVar6;
    pTVar5[1].order = R;
    pTVar5[1].type = SNORM_INT8;
    *(undefined1 *)&pTVar5[2].order = R;
    std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_88);
    if (local_88 != (TextureFormat)&local_78) {
      operator_delete((void *)local_88,local_78 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    local_a8._4_4_ = (uint)(uVar1 != 0x9009 && uVar1 != 0x8513) * 4 + 4;
    local_a8._0_4_ = 4;
    uStack_a0 = 1;
    if ((int)local_100._0_4_ < 0x9009) {
      if ((local_100._0_4_ == 0x806f) || (local_100._0_4_ == 0x8c1a)) {
LAB_014e4e57:
        uStack_a0 = 6;
      }
    }
    else if ((local_100._0_4_ == 0x9009) || (local_100._0_4_ == 0x9102)) goto LAB_014e4e57;
    iStack_9c = 3;
    GStack_98 = 0x8058;
    local_94 = false;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ::push_back(&local_e0,(value_type *)&local_a8);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
    ::push_back(local_68,(value_type *)local_100);
    goto LAB_014e4e90;
  }
  local_100._20_4_ = 0x100;
  local_100[0x18] = false;
  local_e0.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e0.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e0.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0 = 0;
  local_b8._M_local_buf[0] = '\0';
  local_100._12_4_ = 1;
  local_100._16_4_ = 0;
  local_a8._0_4_ = 0;
  local_a8._4_4_ = 0;
  uStack_a0 = 0;
  iStack_9c = 0;
  GStack_98 = 0x1908;
  local_94 = false;
  local_100._4_4_ = uVar1;
  local_100[8] = true;
  local_100[9] = false;
  local_58 = glu::getTextureTargetName;
  local_c8._M_p = (pointer)&local_b8;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_120,&local_58);
  pTVar5 = (TextureFormat *)std::__cxx11::string::append((char *)&local_120);
  TVar6 = (TextureFormat)(pTVar5 + 2);
  if (*pTVar5 == TVar6) {
    local_78 = *(long *)TVar6;
    TStack_70 = pTVar5[3];
    local_88 = (TextureFormat)&local_78;
  }
  else {
    local_78 = *(long *)TVar6;
    local_88 = *pTVar5;
  }
  local_80 = pTVar5[1];
  *pTVar5 = TVar6;
  pTVar5[1].order = R;
  pTVar5[1].type = SNORM_INT8;
  *(undefined1 *)&pTVar5[2].order = R;
  std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_88);
  if (local_88 != (TextureFormat)&local_78) {
    operator_delete((void *)local_88,local_78 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  local_a8._0_4_ = 0x10;
  local_a8._4_4_ = 0x10;
  uStack_a0 = 1;
  if ((int)local_100._0_4_ < 0x9009) {
    if ((local_100._0_4_ == 0x806f) || (local_100._0_4_ == 0x8c1a)) {
LAB_014e4389:
      uStack_a0 = 6;
    }
  }
  else if ((local_100._0_4_ == 0x9009) || (local_100._0_4_ == 0x9102)) goto LAB_014e4389;
  iStack_9c = 0;
  GStack_98 = 0x8058;
  local_94 = false;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
  ::push_back(&local_e0,(value_type *)&local_a8);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
  ::push_back(local_68,(value_type *)local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_p != &local_b8) {
    operator_delete(local_c8._M_p,
                    CONCAT71(local_b8._M_allocated_capacity._1_7_,local_b8._M_local_buf[0]) + 1);
  }
  if (local_e0.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e0.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_100._16_4_ = 0;
  local_100._20_4_ = 0x100;
  local_100[0x18] = false;
  local_e0.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e0.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e0.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0 = 0;
  local_b8._M_local_buf[0] = '\0';
  local_a8._0_4_ = 0;
  local_a8._4_4_ = 0;
  uStack_a0 = 0;
  iStack_9c = 0;
  GStack_98 = 0x1908;
  local_94 = false;
  local_100._0_4_ = uVar1;
  local_100[8] = true;
  local_100[9] = false;
  local_100._12_4_ = local_5c;
  local_58 = glu::getTextureTargetName;
  local_c8._M_p = (pointer)&local_b8;
  local_50 = uVar1;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_120,&local_58);
  pTVar5 = (TextureFormat *)std::__cxx11::string::append((char *)&local_120);
  TVar6 = (TextureFormat)(pTVar5 + 2);
  if (*pTVar5 == TVar6) {
    local_78 = *(long *)TVar6;
    TStack_70 = pTVar5[3];
    local_88 = (TextureFormat)&local_78;
  }
  else {
    local_78 = *(long *)TVar6;
    local_88 = *pTVar5;
  }
  local_80 = pTVar5[1];
  *pTVar5 = TVar6;
  pTVar5[1].order = R;
  pTVar5[1].type = SNORM_INT8;
  *(undefined1 *)&pTVar5[2].order = R;
  std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_88);
  if (local_88 != (TextureFormat)&local_78) {
    operator_delete((void *)local_88,local_78 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  local_a8._0_4_ = 0x20;
  local_a8._4_4_ = 0x20;
  uStack_a0 = 1;
  if ((int)local_100._0_4_ < 0x9009) {
    if ((local_100._0_4_ == 0x806f) || (local_100._0_4_ == 0x8c1a)) {
LAB_014e455f:
      uStack_a0 = 6;
    }
  }
  else if ((local_100._0_4_ == 0x9009) || (local_100._0_4_ == 0x9102)) goto LAB_014e455f;
  iStack_9c = 0;
  GStack_98 = 0x8058;
  local_94 = false;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
  ::push_back(&local_e0,(value_type *)&local_a8);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
  ::push_back(local_68,(value_type *)local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_p != &local_b8) {
    operator_delete(local_c8._M_p,
                    CONCAT71(local_b8._M_allocated_capacity._1_7_,local_b8._M_local_buf[0]) + 1);
  }
  if (local_e0.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e0.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_100._16_4_ = 0;
  local_100._20_4_ = 0x100;
  local_100[0x18] = false;
  local_e0.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e0.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e0.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0 = 0;
  local_b8._M_local_buf[0] = '\0';
  local_a8._0_4_ = 0;
  local_a8._4_4_ = 0;
  uStack_a0 = 0;
  iStack_9c = 0;
  GStack_98 = 0x1908;
  local_94 = false;
  local_100._0_4_ = uVar1;
  local_100[8] = true;
  local_100[9] = true;
  local_100._12_4_ = local_5c;
  local_58 = glu::getTextureTargetName;
  local_c8._M_p = (pointer)&local_b8;
  local_50 = uVar1;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_120,&local_58);
  pTVar5 = (TextureFormat *)std::__cxx11::string::append((char *)&local_120);
  TVar6 = (TextureFormat)(pTVar5 + 2);
  if (*pTVar5 == TVar6) {
    local_78 = *(long *)TVar6;
    TStack_70 = pTVar5[3];
    local_88 = (TextureFormat)&local_78;
  }
  else {
    local_78 = *(long *)TVar6;
    local_88 = *pTVar5;
  }
  local_80 = pTVar5[1];
  *pTVar5 = TVar6;
  pTVar5[1].order = R;
  pTVar5[1].type = SNORM_INT8;
  *(undefined1 *)&pTVar5[2].order = R;
  std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_88);
  if (local_88 != (TextureFormat)&local_78) {
    operator_delete((void *)local_88,local_78 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  local_a8._0_4_ = 0x20;
  local_a8._4_4_ = 0x20;
  uStack_a0 = 1;
  if ((int)local_100._0_4_ < 0x9009) {
    if ((local_100._0_4_ == 0x806f) || (local_100._0_4_ == 0x8c1a)) {
LAB_014e471e:
      uStack_a0 = 6;
    }
  }
  else if ((local_100._0_4_ == 0x9009) || (local_100._0_4_ == 0x9102)) goto LAB_014e471e;
  iStack_9c = 0;
  GStack_98 = 0x8058;
  local_94 = false;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
  ::push_back(&local_e0,(value_type *)&local_a8);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
  ::push_back(local_68,(value_type *)local_100);
LAB_014e4e90:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_p != &local_b8) {
    operator_delete(local_c8._M_p,
                    CONCAT71(local_b8._M_allocated_capacity._1_7_,local_b8._M_local_buf[0]) + 1);
  }
  if (local_e0.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e0.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.
                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TextureLevelCommonCase::generateTestIterations (std::vector<TextureGenerationSpec>& iterations)
{
	const glw::GLenum	internalFormat = GL_RGBA8;
	int					maxSamples;
	std::vector<int>	samples;

	getFormatSamples(internalFormat, samples);
	if (samples.empty())
		maxSamples = -1;
	else
		maxSamples = samples[0];

	generateColorTextureGenerationGroup(iterations, m_target, maxSamples, internalFormat);
}